

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)7>_> *
vkt::api::anon_unknown_1::DeviceMemory::create
          (Move<vk::Handle<(vk::HandleType)7>_> *__return_storage_ptr__,Environment *env,
          Resources *param_2,Parameters *params)

{
  undefined1 local_48 [8];
  VkMemoryAllocateInfo allocInfo;
  Parameters *params_local;
  Resources *param_1_local;
  Environment *env_local;
  
  local_48._0_4_ = VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO;
  allocInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  allocInfo._4_4_ = 0;
  allocInfo.pNext = (void *)params->size;
  allocInfo.allocationSize._0_4_ = params->memoryTypeIndex;
  allocInfo._24_8_ = params;
  ::vk::allocateMemory
            (__return_storage_ptr__,env->vkd,env->device,(VkMemoryAllocateInfo *)local_48,
             env->allocationCallbacks);
  return __return_storage_ptr__;
}

Assistant:

static Move<VkDeviceMemory> create (const Environment& env, const Resources&, const Parameters& params)
	{
		const VkMemoryAllocateInfo	allocInfo	=
		{
			VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO,
			DE_NULL,
			params.size,
			params.memoryTypeIndex
		};

		return allocateMemory(env.vkd, env.device, &allocInfo, env.allocationCallbacks);
	}